

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

void Sle_ManCollectCutFaninsOne
               (Gia_Man_t *pGia,int iObj,Vec_Int_t *vCuts,Vec_Bit_t *vMask,Vec_Int_t *vCutFanins,
               Vec_Bit_t *vMap)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *pC;
  int k;
  int nSize;
  int *pList;
  int *pCut;
  int iFanin;
  int i;
  Vec_Bit_t *vMap_local;
  Vec_Int_t *vCutFanins_local;
  Vec_Bit_t *vMask_local;
  Vec_Int_t *vCuts_local;
  int iObj_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Vec_IntEntry(vCuts,iObj);
  piVar3 = Vec_IntEntryP(vCuts,iVar1);
  pCut._4_4_ = 0;
  pList = piVar3 + 1;
  while( true ) {
    if (*piVar3 <= pCut._4_4_) {
      for (pCut._4_4_ = 0; iVar1 = Vec_IntSize(vCutFanins), pCut._4_4_ < iVar1;
          pCut._4_4_ = pCut._4_4_ + 1) {
        iVar1 = Vec_IntEntry(vCutFanins,pCut._4_4_);
        Vec_BitWriteEntry(vMap,iVar1,0);
      }
      return;
    }
    iVar1 = Sle_CutSize(pList);
    piVar4 = Sle_CutLeaves(pList);
    if (iVar1 < 2) break;
    for (pC._0_4_ = 0; (int)pC < iVar1; pC._0_4_ = (int)pC + 1) {
      iVar2 = Vec_BitEntry(vMask,piVar4[(int)pC]);
      if ((iVar2 != 0) && (iVar2 = Vec_BitEntry(vMap,piVar4[(int)pC]), iVar2 == 0)) {
        Vec_BitWriteEntry(vMap,piVar4[(int)pC],1);
        Vec_IntPush(vCutFanins,piVar4[(int)pC]);
      }
    }
    pCut._4_4_ = pCut._4_4_ + 1;
    iVar1 = Sle_CutSize(pList);
    pList = pList + (iVar1 + 1);
  }
  __assert_fail("nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                ,0x17a,
                "void Sle_ManCollectCutFaninsOne(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *, Vec_Int_t *, Vec_Bit_t *)"
               );
}

Assistant:

void Sle_ManCollectCutFaninsOne( Gia_Man_t * pGia, int iObj, Vec_Int_t * vCuts, Vec_Bit_t * vMask, Vec_Int_t * vCutFanins, Vec_Bit_t * vMap )
{
    int i, iFanin, * pCut, * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    Sle_ForEachCut( pList, pCut, i )
    {
        int nSize   = Sle_CutSize(pCut);
        int k, * pC = Sle_CutLeaves(pCut);
        assert( nSize > 1 );
        for ( k = 0; k < nSize; k++ )
            if ( Vec_BitEntry(vMask, pC[k]) && !Vec_BitEntry(vMap, pC[k]) )
            {
                Vec_BitWriteEntry( vMap, pC[k], 1 );
                Vec_IntPush( vCutFanins, pC[k] );
            }
    }
    Vec_IntForEachEntry( vCutFanins, iFanin, i )
        Vec_BitWriteEntry( vMap, iFanin, 0 );
}